

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O1

void pzshape::TPZShapeQuad::TransformDerivative2dQ(int transid,int num,TPZFMatrix<double> *in)

{
  double dVar1;
  double dVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  if (0 < num) {
    lVar5 = (long)transid * 0x20;
    uVar4 = 0;
    do {
      if (((in->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((in->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar4)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar3 = (in->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      dVar1 = in->fElem[lVar3 * uVar4];
      if ((lVar3 < 2) || ((in->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar4)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar3 = (in->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      dVar2 = in->fElem[lVar3 * uVar4 + 1];
      if ((lVar3 < 1) || ((in->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar4)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar3 = (in->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      in->fElem[lVar3 * uVar4] =
           *(double *)(gTrans2dQ + lVar5) * dVar1 + *(double *)(gTrans2dQ + lVar5 + 0x10) * dVar2;
      if ((lVar3 < 2) || ((in->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar4)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      in->fElem[(in->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * uVar4 + 1] =
           dVar1 * *(double *)(gTrans2dQ + lVar5 + 8) +
           dVar2 * *(double *)(gTrans2dQ + lVar5 + 0x18);
      uVar4 = uVar4 + 1;
    } while ((uint)num != uVar4);
  }
  return;
}

Assistant:

void TPZShapeQuad::TransformDerivative2dQ(int transid, int num, TPZFMatrix<REAL> &in) {
		
		for(int i=0;i<num;i++) {
			REAL aux[2];
			aux[0] = in(0,i);
			aux[1] = in(1,i);
			in(0,i) = gTrans2dQ[transid][0][0]*aux[0]+gTrans2dQ[transid][1][0]*aux[1];
			in(1,i) = gTrans2dQ[transid][0][1]*aux[0]+gTrans2dQ[transid][1][1]*aux[1];
		}
	}